

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logmath.c
# Opt level: O3

logmath_t * logmath_read(char *file_name)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int32 iVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  logmath_t *lmath;
  ulong uVar7;
  void *pvVar8;
  size_t sVar9;
  mmio_file_t *mf;
  char *pcVar10;
  char **ppcVar11;
  long lVar12;
  double dVar13;
  undefined1 auVar14 [16];
  int32 byteswap;
  char **argval;
  uint32 chksum;
  char **argname;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar15;
  int32 local_5c;
  char **local_58;
  uint32 local_50;
  undefined4 local_4c;
  char **local_48;
  char *local_40;
  FILE *local_38;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
          ,0xaf,"Reading log table file \'%s\'\n",file_name);
  __stream = fopen(file_name,"rb");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                   ,0xb1,"Failed to open log table file \'%s\' for reading",file_name);
    return (logmath_t *)0x0;
  }
  iVar4 = bio_readhdr((FILE *)__stream,&local_48,&local_58,&local_5c);
  if (iVar4 < 0) {
    lmath = (logmath_t *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
            ,0xb7,"Failed to read the header from the file \'%s\'\n",file_name);
    goto LAB_0011b65c;
  }
  local_38 = __stream;
  lmath = (logmath_t *)
          __ckd_calloc__(1,0x50,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                         ,0xbc);
  uVar15 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  (lmath->t).width = '\x02';
  (lmath->t).shift = '\0';
  lmath->base = 1.0001;
  pcVar10 = *local_48;
  if (pcVar10 == (char *)0x0) {
    bVar3 = true;
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    bVar3 = false;
    ppcVar11 = local_48;
    local_40 = file_name;
    do {
      iVar5 = strcmp(pcVar10,"version");
      if (iVar5 != 0) {
        iVar5 = strcmp(pcVar10,"chksum0");
        if (iVar5 == 0) {
          iVar5 = strcmp(local_58[lVar12],"yes");
          if (iVar5 == 0) {
            bVar3 = true;
          }
        }
        else {
          iVar5 = strcmp(pcVar10,"width");
          if (iVar5 == 0) {
            iVar5 = atoi(local_58[lVar12]);
            (lmath->t).width = (uint8)iVar5;
          }
          else {
            iVar5 = strcmp(pcVar10,"shift");
            if (iVar5 == 0) {
              iVar5 = atoi(local_58[lVar12]);
              (lmath->t).shift = (int8)iVar5;
            }
            else {
              iVar5 = strcmp(pcVar10,"logbase");
              if (iVar5 == 0) {
                dVar13 = atof_c(local_58[lVar12]);
                lmath->base = (float64)dVar13;
                ppcVar11 = local_48;
              }
            }
          }
        }
      }
      uVar15 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      pcVar10 = ppcVar11[lVar12 + 1];
      lVar12 = lVar12 + 1;
    } while (pcVar10 != (char *)0x0);
    bVar3 = !bVar3;
    local_48 = ppcVar11;
    file_name = local_40;
  }
  local_4c = (undefined4)lVar12;
  bio_hdrarg_free(local_48,local_58);
  local_50 = 0;
  dVar13 = log((double)lmath->base);
  lmath->log_of_base = (float64)dVar13;
  dVar13 = log10((double)lmath->base);
  __stream = local_38;
  lmath->log10_of_base = (float64)dVar13;
  auVar14._8_8_ = dVar13;
  auVar14._0_8_ = lmath->log_of_base;
  auVar14 = divpd(_DAT_001532f0,auVar14);
  lmath->inv_log_of_base = (float64)auVar14._0_8_;
  lmath->inv_log10_of_base = (float64)auVar14._8_8_;
  lmath->zero = -0x80000000 >> ((lmath->t).shift + 2U & 0x1f);
  iVar4 = bio_fread(&(lmath->t).table_size,4,1,(FILE *)local_38,local_5c,&local_50);
  if (iVar4 == 1) {
    uVar7 = ftell(__stream);
    bVar1 = (lmath->t).width;
    if (((ulong)bVar1 - 1 & uVar7) == 0) {
      if (local_5c == 0) {
        mf = mmio_file_read(file_name);
        lmath->filemap = mf;
        pvVar8 = mmio_file_ptr(mf);
        (lmath->t).table = (void *)((long)pvVar8 + uVar7);
        goto LAB_0011b65c;
      }
LAB_0011b55f:
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
              ,0xf0,"%s: Data is wrong-endian, will not memory map\n",file_name);
    }
    else {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
              ,0xeb,"%s: Data start %ld is not aligned on %d-byte boundary, will not memory map\n",
              file_name,uVar7,CONCAT44(uVar15,(uint)bVar1));
      if (local_5c != 0) goto LAB_0011b55f;
    }
    pvVar8 = __ckd_calloc__((ulong)(lmath->t).table_size,(ulong)(lmath->t).width,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
                            ,0xf9);
    (lmath->t).table = pvVar8;
    uVar6 = bio_fread(pvVar8,(uint)(lmath->t).width,(lmath->t).table_size,(FILE *)__stream,local_5c,
                      &local_50);
    uVar2 = (lmath->t).table_size;
    if (uVar6 != uVar2) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
              ,0xfd,"Failed to read data (%d x %d bytes) from the file \'%s\' failed",(ulong)uVar2,
              (ulong)(lmath->t).width,file_name);
      goto LAB_0011b633;
    }
    if (!bVar3) {
      bio_verify_chksum((FILE *)__stream,local_5c,local_50);
    }
    sVar9 = fread(&local_4c,1,1,__stream);
    if (sVar9 != 1) {
LAB_0011b65c:
      fclose(__stream);
      return lmath;
    }
    pcVar10 = "%s: More data than expected\n";
    lVar12 = 0x104;
  }
  else {
    pcVar10 = "Failed to read values from the file \'%s\'";
    lVar12 = 0xe2;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/logmath.c"
          ,lVar12,pcVar10,file_name);
LAB_0011b633:
  logmath_free(lmath);
  return (logmath_t *)0x0;
}

Assistant:

logmath_t *
logmath_read(const char *file_name)
{
    logmath_t *lmath;
    char **argname, **argval;
    int32 byteswap, i;
    int chksum_present, do_mmap;
    uint32 chksum;
    long pos;
    FILE *fp;

    E_INFO("Reading log table file '%s'\n", file_name);
    if ((fp = fopen(file_name, "rb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open log table file '%s' for reading", file_name);
        return NULL;
    }

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &byteswap) < 0) {
        E_ERROR("Failed to read the header from the file '%s'\n", file_name);
        fclose(fp);
        return NULL;
    }

    lmath = ckd_calloc(1, sizeof(*lmath));
    /* Default values. */
    lmath->t.shift = 0;
    lmath->t.width = 2;
    lmath->base = 1.0001;

    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            if (strcmp(argval[i], "yes") == 0)
                chksum_present = 1;
        }
        else if (strcmp(argname[i], "width") == 0) {
            lmath->t.width = atoi(argval[i]);
        }
        else if (strcmp(argname[i], "shift") == 0) {
            lmath->t.shift = atoi(argval[i]);
        }
        else if (strcmp(argname[i], "logbase") == 0) {
            lmath->base = atof_c(argval[i]);
        }
    }
    bio_hdrarg_free(argname, argval);
    chksum = 0;

    /* Set up various necessary constants. */
    lmath->log_of_base = log(lmath->base);
    lmath->log10_of_base = log10(lmath->base);
    lmath->inv_log_of_base = 1.0/lmath->log_of_base;
    lmath->inv_log10_of_base = 1.0/lmath->log10_of_base;
    /* Shift this sufficiently that overflows can be avoided. */
    lmath->zero = MAX_NEG_INT32 >> (lmath->t.shift + 2);

    /* #Values to follow */
    if (bio_fread(&lmath->t.table_size, sizeof(int32), 1, fp, byteswap, &chksum) != 1) {
        E_ERROR("Failed to read values from the file '%s'", file_name);
        goto error_out;
    }

    /* Check alignment constraints for memory mapping */
    do_mmap = 1;
    pos = ftell(fp);
    if (pos & ((long)lmath->t.width - 1)) {
        E_WARN("%s: Data start %ld is not aligned on %d-byte boundary, will not memory map\n",
                  file_name, pos, lmath->t.width);
        do_mmap = 0;
    }
    /* Check byte order for memory mapping */
    if (byteswap) {
        E_WARN("%s: Data is wrong-endian, will not memory map\n", file_name);
        do_mmap = 0;
    }

    if (do_mmap) {
        lmath->filemap = mmio_file_read(file_name);
        lmath->t.table = (char *)mmio_file_ptr(lmath->filemap) + pos;
    }
    else {
        lmath->t.table = ckd_calloc(lmath->t.table_size, lmath->t.width);
        if ((uint32)bio_fread(lmath->t.table, lmath->t.width, lmath->t.table_size,
                      fp, byteswap, &chksum) != lmath->t.table_size) {
            E_ERROR("Failed to read data (%d x %d bytes) from the file '%s' failed",
                    lmath->t.table_size, lmath->t.width, file_name);
            goto error_out;
        }
        if (chksum_present)
            bio_verify_chksum(fp, byteswap, chksum);

        if (fread(&i, 1, 1, fp) == 1) {
            E_ERROR("%s: More data than expected\n", file_name);
            goto error_out;
        }
    }
    fclose(fp);

    return lmath;
error_out:
    logmath_free(lmath);
    return NULL;
}